

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

void rw::Matrix::makeRotation(Matrix *dst,Quat *q)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float wz;
  float wy;
  float wx;
  float xy;
  float zx;
  float yz;
  float zz;
  float yy;
  float xx;
  Quat *q_local;
  Matrix *dst_local;
  
  fVar1 = (float)q->x * (float)q->x;
  fVar2 = (float)q->y * (float)q->y;
  fVar3 = (float)q->z * (float)q->z;
  fVar4 = (float)q->y * (float)q->z;
  fVar5 = (float)q->z * (float)q->x;
  fVar6 = (float)q->x * (float)q->y;
  fVar7 = (float)q->w * (float)q->x;
  fVar8 = (float)q->w * (float)q->y;
  fVar9 = (float)q->w * (float)q->z;
  fVar10 = fVar2 + fVar3;
  (dst->right).x = (float32)(1.0 - (fVar10 + fVar10));
  (dst->right).y = (float32)((fVar6 + fVar9) * 2.0);
  (dst->right).z = (float32)((fVar5 - fVar8) * 2.0);
  (dst->up).x = (float32)((fVar6 - fVar9) * 2.0);
  fVar3 = fVar1 + fVar3;
  (dst->up).y = (float32)(1.0 - (fVar3 + fVar3));
  (dst->up).z = (float32)((fVar4 + fVar7) * 2.0);
  (dst->at).x = (float32)((fVar5 + fVar8) * 2.0);
  (dst->at).y = (float32)((fVar4 - fVar7) * 2.0);
  fVar1 = fVar1 + fVar2;
  (dst->at).z = (float32)(1.0 - (fVar1 + fVar1));
  (dst->pos).x = 0.0;
  (dst->pos).y = 0.0;
  (dst->pos).z = 0.0;
  dst->flags = 3;
  return;
}

Assistant:

void
Matrix::makeRotation(Matrix *dst, const Quat &q)
{
	float xx = q.x*q.x;
	float yy = q.y*q.y;
	float zz = q.z*q.z;
	float yz = q.y*q.z;
	float zx = q.z*q.x;
	float xy = q.x*q.y;
	float wx = q.w*q.x;
	float wy = q.w*q.y;
	float wz = q.w*q.z;

	dst->right.x = 1.0f - 2.0f*(yy + zz);
	dst->right.y =        2.0f*(xy + wz);
	dst->right.z =        2.0f*(zx - wy);
	dst->up.x =        2.0f*(xy - wz);
	dst->up.y = 1.0f - 2.0f*(xx + zz);
	dst->up.z =        2.0f*(yz + wx);
	dst->at.x =        2.0f*(zx + wy);
	dst->at.y =        2.0f*(yz - wx);
	dst->at.z = 1.0f - 2.0f*(xx + yy);
	dst->pos.x = 0.0;
	dst->pos.y = 0.0;
	dst->pos.z = 0.0;
	dst->flags = TYPEORTHONORMAL;
}